

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O1

ostream * std::operator<<(ostream *os,vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *v)

{
  pointer pWVar1;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  if ((v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar3 = "[]";
    lVar5 = 2;
  }
  else {
    uVar4 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    pWVar1 = (v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>(os,"{\"word\": \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pWVar1->word)._M_dataplus._M_p,(pWVar1->word)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", \"offset\": ",0xd);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
    if (1 < (ulong)(((long)(v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
      lVar5 = 0x50;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        pWVar1 = (v->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>(os,"{\"word\": \"",10);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)((long)pWVar1 + lVar5 + -0x20),
                            *(long *)((long)pWVar1 + lVar5 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", \"offset\": ",0xd);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (uVar4 < (ulong)(((long)(v->
                                      super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(v->
                                      super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x5555555555555555));
    }
    pcVar3 = "]";
    lVar5 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar5);
  return os;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}